

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server-ws.c
# Opt level: O1

int lws_parse_ws(lws *wsi,uchar **buf,size_t len)

{
  undefined1 *puVar1;
  byte bVar2;
  _lws_websocket_related *p_Var3;
  byte *buf_00;
  lws_callback_function *callback_function;
  uchar *puVar4;
  ulong uVar5;
  int iVar6;
  byte *pbVar7;
  uint uVar8;
  size_t len_00;
  long lVar9;
  ulong uVar10;
  char *buf_01;
  uint uVar11;
  undefined8 uVar12;
  uchar **ppuVar13;
  bool bVar14;
  byte local_44 [4];
  uchar **local_40;
  uchar *local_38;
  
  local_38 = *buf;
  local_40 = buf;
  _lws_log(0x10,"%s: received %d byte packet\n","lws_parse_ws",len & 0xffffffff);
  do {
    if (len == 0) {
      _lws_log(0x10,"%s: exit with %d unused\n","lws_parse_ws",0);
      return 0;
    }
    if (wsi->rxflow_bitmap != '\0') {
      _lws_log(8,"%s: doing rxflow, caching %d\n","lws_parse_ws",len & 0xffffffff);
      ppuVar13 = local_40;
      iVar6 = lws_rxflow_cache(wsi,*local_40,0,len);
      if (iVar6 == 2) {
        _lws_log(8,"%s: trimming inside rxflow cache\n","lws_parse_ws");
      }
      else {
        local_38 = *ppuVar13 + len;
      }
      *ppuVar13 = local_38;
      return 1;
    }
    uVar12 = 0;
    ppuVar13 = local_40;
    if (wsi->lws_rx_parse_state == '\x14') {
      uVar12 = 0;
      do {
        p_Var3 = wsi->ws;
        if ((byte)(p_Var3->opcode - 1) < 2) {
          if (len == 0) {
            len = 0;
            break;
          }
        }
        else if ((p_Var3->opcode != '\0') || (len == 0)) break;
        uVar10 = ((wsi->a).protocol)->rx_buffer_size;
        if (uVar10 == 0) {
          uVar10 = (ulong)((wsi->a).context)->pt_serv_buf_size;
        }
        buf_00 = *ppuVar13;
        uVar5 = p_Var3->rx_packet_length;
        if ((uVar10 & 0xffffffff) <= p_Var3->rx_packet_length) {
          uVar5 = uVar10;
        }
        uVar11 = (uint)uVar5;
        if (len < (uVar5 & 0xffffffff)) {
          uVar11 = (uint)len;
        }
        if (uVar11 == 0) {
          uVar8 = 0;
        }
        else {
          if ((p_Var3->field_0x95 & 4) == 0) {
            bVar2 = p_Var3->mask_idx;
            lVar9 = 0;
            do {
              local_44[lVar9] = p_Var3->mask[(uint)bVar2 + (int)lVar9 & 3];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 4);
            pbVar7 = buf_00;
            if (3 < uVar11) {
              uVar8 = uVar11 >> 2;
              do {
                *pbVar7 = *pbVar7 ^ local_44[0];
                pbVar7[1] = pbVar7[1] ^ local_44[1];
                pbVar7[2] = pbVar7[2] ^ local_44[2];
                pbVar7[3] = pbVar7[3] ^ local_44[3];
                pbVar7 = pbVar7 + 4;
                uVar8 = uVar8 - 1;
              } while (uVar8 != 0);
            }
            bVar14 = (uVar11 & 3) != 0;
            if (bVar14) {
              uVar10 = 0;
              do {
                pbVar7[uVar10] = pbVar7[uVar10] ^ local_44[uVar10];
                uVar10 = uVar10 + 1;
              } while ((uVar11 & 3) != uVar10);
            }
            wsi->ws->mask_idx = wsi->ws->mask_idx + (char)uVar11 & 3;
          }
          else {
            bVar14 = false;
          }
          _lws_log(8,"%s: using %d of raw input (total %d on offer)\n",
                   "lws_ws_frame_rest_is_payload",(ulong)uVar11,len & 0xffffffff);
          uVar10 = (ulong)uVar11;
          *local_40 = *local_40 + uVar10;
          p_Var3 = wsi->ws;
          p_Var3->rx_packet_length = p_Var3->rx_packet_length - uVar10;
          if ((*(ushort *)&p_Var3->field_0x95 & 0xc00) == 0x400) {
            iVar6 = lws_check_utf8(&p_Var3->utf8,buf_00,uVar10);
            if (iVar6 == 0) {
              p_Var3 = wsi->ws;
              if (((p_Var3->rx_packet_length != 0) || ((p_Var3->field_0x95 & 1) == 0)) ||
                 (bVar14 || p_Var3->utf8 == '\0')) goto LAB_0012e8da;
              _lws_log(8,"FINAL utf8 error\n");
              len_00 = 0xc;
              buf_01 = "partial utf8";
            }
            else {
              len_00 = 8;
              buf_01 = "bad utf8";
            }
            lws_close_reason(wsi,LWS_CLOSE_STATUS_INVALID_PAYLOAD,(uchar *)buf_01,len_00);
            _lws_log(8,"utf8 error\n");
            lwsl_hexdump_level(8,buf_00,(long)(int)uVar11);
            ppuVar13 = local_40;
            uVar8 = 0xffffffff;
          }
          else {
LAB_0012e8da:
            callback_function = ((wsi->a).protocol)->callback;
            if ((callback_function != (lws_callback_function *)0x0) &&
               (wsi->wsistate_pre_close == 0)) {
              iVar6 = user_callback_handle_rxflow
                                (callback_function,wsi,LWS_CALLBACK_RECEIVE,wsi->user_space,buf_00,
                                 uVar10);
              uVar8 = 0xffffffff;
              ppuVar13 = local_40;
              if (iVar6 != 0) goto LAB_0012e903;
            }
            puVar1 = &wsi->ws->field_0x95;
            *(ushort *)puVar1 = *(ushort *)puVar1 & 0xbfff;
            ppuVar13 = local_40;
            uVar8 = uVar11;
          }
        }
LAB_0012e903:
        puVar4 = *ppuVar13;
        if ((int)(uint)len < (int)((long)puVar4 - (long)buf_00)) {
          __assert_fail("(int)lws_ptr_diff(*buf, bin) <= (int)len",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/ws/server-ws.c"
                        ,0x41d,"int lws_parse_ws(struct lws *, unsigned char **, size_t)");
        }
        if (uVar8 == 0) {
          iVar6 = 5;
        }
        else {
          iVar6 = 0;
          if ((int)uVar8 < 0) {
            _lws_log(8,"%s: rest_is_payload bailed\n","lws_parse_ws");
            iVar6 = 1;
            ppuVar13 = local_40;
          }
        }
        len = len - ((long)puVar4 - (long)buf_00);
        uVar12 = 1;
        if (iVar6 != 0) {
          if (iVar6 != 5) {
            return -1;
          }
          break;
        }
      } while (wsi->lws_rx_parse_state == '\x14');
    }
    if ((int)uVar12 == 0) {
      puVar4 = *ppuVar13;
      *ppuVar13 = puVar4 + 1;
      iVar6 = lws_ws_rx_sm(wsi,'\0',*puVar4);
      len = len - 1;
    }
    else {
      iVar6 = lws_ws_rx_sm(wsi,'\x03','\0');
    }
    if (iVar6 < 0) {
      _lws_log(8,"%s: lws_ws_rx_sm bailed %d\n","lws_parse_ws",uVar12);
      return -1;
    }
  } while( true );
}

Assistant:

int
lws_parse_ws(struct lws *wsi, unsigned char **buf, size_t len)
{
	unsigned char *bufin = *buf;
	int m, bulk = 0;

	lwsl_debug("%s: received %d byte packet\n", __func__, (int)len);

	//lwsl_hexdump_notice(*buf, len);

	/* let the rx protocol state machine have as much as it needs */

	while (len) {
		/*
		 * we were accepting input but now we stopped doing so
		 */
		if (wsi->rxflow_bitmap) {
			lwsl_info("%s: doing rxflow, caching %d\n", __func__,
				(int)len);
			/*
			 * Since we cached the remaining available input, we
			 * can say we "consumed" it.
			 *
			 * But what about the case where the available input
			 * came out of the rxflow cache already?  If we are
			 * effectively "putting it back in the cache", we have
			 * leave it where it is, already pointed to by the head.
			 */
			if (lws_rxflow_cache(wsi, *buf, 0, len) ==
							LWSRXFC_TRIMMED) {
				/*
				 * We dealt with it by trimming the existing
				 * rxflow cache HEAD to account for what we used.
				 *
				 * so he doesn't do any consumed processing
				 */
				lwsl_info("%s: trimming inside rxflow cache\n",
					  __func__);
				*buf = bufin;
			} else
				*buf += len;

			return 1;
		}
#if !defined(LWS_WITHOUT_EXTENSIONS)
		if (wsi->ws->rx_draining_ext) {
			lwsl_debug("%s: draining rx ext\n", __func__);
			m = lws_ws_rx_sm(wsi, ALREADY_PROCESSED_IGNORE_CHAR, 0);
			if (m < 0)
				return -1;
			continue;
		}
#endif

		/* consume payload bytes efficiently */
		while (wsi->lws_rx_parse_state == LWS_RXPS_WS_FRAME_PAYLOAD &&
				(wsi->ws->opcode == LWSWSOPC_TEXT_FRAME ||
				 wsi->ws->opcode == LWSWSOPC_BINARY_FRAME ||
				 wsi->ws->opcode == LWSWSOPC_CONTINUATION) &&
		       len) {
			uint8_t *bin = *buf;

			bulk = 1;
			m = lws_ws_frame_rest_is_payload(wsi, buf, len);
			assert((int)lws_ptr_diff(*buf, bin) <= (int)len);
			len -= lws_ptr_diff_size_t(*buf, bin);

			if (!m) {

				break;
			}
			if (m < 0) {
				lwsl_info("%s: rest_is_payload bailed\n",
					  __func__);
				return -1;
			}
		}

		if (!bulk) {
			/* process the byte */
			m = lws_ws_rx_sm(wsi, 0, *(*buf)++);
			len--;
		} else {
			/*
			 * We already handled this byte in bulk, just deal
			 * with the ramifications
			 */
#if !defined(LWS_WITHOUT_EXTENSIONS)
			lwsl_debug("%s: coming out of bulk with len %d, "
				   "wsi->ws->rx_draining_ext %d\n",
				   __func__, (int)len,
				   wsi->ws->rx_draining_ext);
#endif
			m = lws_ws_rx_sm(wsi, ALREADY_PROCESSED_IGNORE_CHAR |
					      ALREADY_PROCESSED_NO_CB, 0);
		}

		if (m < 0) {
			lwsl_info("%s: lws_ws_rx_sm bailed %d\n", __func__,
				  bulk);

			return -1;
		}

		bulk = 0;
	}

	lwsl_debug("%s: exit with %d unused\n", __func__, (int)len);

	return 0;
}